

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O3

int __thiscall
ActionActiveReturn::clone
          (ActionActiveReturn *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  const_iterator cVar1;
  ActionActiveReturn *this_00;
  string *__k;
  
  __k = &(this->super_Action).basegroup;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__fn,__k);
  if (cVar1._M_node == (_Base_ptr)(__fn + 8)) {
    this_00 = (ActionActiveReturn *)0x0;
  }
  else {
    this_00 = (ActionActiveReturn *)operator_new(0x68);
    ActionActiveReturn(this_00,__k);
  }
  return (int)this_00;
}

Assistant:

virtual Action *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Action *)0;
    return new ActionActiveReturn(getGroup());
  }